

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O0

Aig_Obj_t * Aig_ObjChild0Repr(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int c;
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  pAVar1 = Aig_ObjFanin0(pObj);
  pAVar1 = Aig_ObjGetRepr(p,pAVar1);
  c = Aig_ObjFaninC0(pObj);
  pAVar1 = Aig_NotCond(pAVar1,c);
  return pAVar1;
}

Assistant:

static inline Aig_Obj_t * Aig_ObjChild0Repr( Aig_Man_t * p, Aig_Obj_t * pObj ) { return Aig_NotCond( Aig_ObjGetRepr(p, Aig_ObjFanin0(pObj)), Aig_ObjFaninC0(pObj) ); }